

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<unsigned_long_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,unsigned_long_long value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t sVar3;
  CharPtr pwVar4;
  CharPtr pwVar5;
  long lVar6;
  char *pcVar7;
  unsigned_long_long uVar8;
  byte bVar9;
  ulong uVar10;
  wchar_t wVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar17;
  
  uVar1 = spec._20_4_;
  uVar17 = 0;
  uVar12 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar9 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar9 = 0x20;
    }
    uVar17 = (uint)bVar9;
    uVar12 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00134e5b;
      if (spec.type_ == 'B') {
LAB_00134d71:
        uVar17 = uVar12;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar12] = 0x30;
          uVar17 = uVar12 | 2;
          (&stack0xffffffffffffffc5)[uVar12] = spec.type_;
        }
        uVar12 = 0;
        uVar8 = value;
        do {
          uVar12 = uVar12 + 1;
          bVar16 = 1 < uVar8;
          uVar8 = uVar8 >> 1;
        } while (bVar16);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar12,&spec,&stack0xffffffffffffffc4,uVar17);
        do {
          *pwVar5 = (uint)value & 1 | 0x30;
          pwVar5 = pwVar5 + -1;
          bVar16 = 1 < value;
          value = value >> 1;
        } while (bVar16);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_00134de2;
      if (spec.type_ == 'b') goto LAB_00134d71;
    }
code_r0x00134fd7:
    internal::report_unknown_type
              (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar17,in_stack_ffffffffffffffc0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar10 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        (&stack0xffffffffffffffc4)[uVar10] = 0x30;
      }
      uVar17 = 0;
      uVar8 = value;
      do {
        uVar17 = uVar17 + 1;
        bVar16 = 7 < uVar8;
        uVar8 = uVar8 >> 3;
      } while (bVar16);
      pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar17,&spec,&stack0xffffffffffffffc4,uVar12);
      do {
        *pwVar5 = (uint)value & 7 | 0x30;
        pwVar5 = pwVar5 + -1;
        bVar16 = 7 < value;
        value = value >> 3;
      } while (bVar16);
      return;
    }
    if (spec.type_ == 'x') {
LAB_00134de2:
      uVar17 = uVar12;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffc4)[uVar12] = 0x30;
        uVar17 = uVar12 | 2;
        (&stack0xffffffffffffffc5)[uVar12] = spec.type_;
      }
      uVar12 = 0;
      uVar8 = value;
      do {
        uVar12 = uVar12 + 1;
        bVar16 = 0xf < uVar8;
        uVar8 = uVar8 >> 4;
      } while (bVar16);
      pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar12,&spec,&stack0xffffffffffffffc4,uVar17);
      pcVar7 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar7 = "0123456789abcdef";
      }
      do {
        *pwVar5 = (int)pcVar7[(uint)value & 0xf];
        pwVar5 = pwVar5 + -1;
        bVar16 = 0xf < value;
        value = value >> 4;
      } while (bVar16);
      return;
    }
    goto code_r0x00134fd7;
  }
  if (spec.type_ == 'd') {
LAB_00134e5b:
    lVar6 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar17 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar17 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar17]))
                             + 1,&spec,&stack0xffffffffffffffc4,uVar12);
    pwVar5 = pwVar5 + 1;
    uVar10 = value;
    if (99 < value) {
      do {
        value = uVar10 / 100;
        uVar14 = (ulong)(uint)((int)uVar10 + (int)value * -100);
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar14 * 2 + 1];
        pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar14 * 2];
        pwVar5 = pwVar5 + -2;
        bVar16 = 9999 < uVar10;
        uVar10 = value;
      } while (bVar16);
    }
    if (value < 10) {
      uVar12 = (uint)value | 0x30;
      lVar6 = -4;
    }
    else {
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((value & 0xffffffff) * 2 & 0xffffffff) + 1];
      uVar12 = (uint)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [(value & 0xffffffff) * 2];
      lVar6 = -8;
    }
    *(uint *)((long)pwVar5 + lVar6) = uVar12;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x00134fd7;
  lVar6 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  uVar17 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  plVar2 = localeconv();
  pcVar7 = plVar2->thousands_sep;
  sVar3 = strlen(pcVar7);
  uVar17 = uVar17 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar17]);
  pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar17 + (int)sVar3 * (uVar17 / 3) + 1,&spec,&stack0xffffffffffffffc4,
                      uVar12);
  pwVar5 = pwVar4 + 1;
  if (value < 100) {
    if (9 < value) {
      uVar10 = (ulong)(uint)((int)value * 2);
      *pwVar4 = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar10 + 1];
      goto LAB_00134fa3;
    }
  }
  else {
    iVar13 = 0;
    do {
      uVar14 = value;
      value = uVar14 / 100;
      uVar10 = (ulong)(uint)(((int)uVar14 + (int)value * -100) * 2);
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar10 + 1];
      pwVar5 = pwVar5 + -1;
      if (iVar13 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar5 = pwVar5 + -sVar3;
        if (0 < (long)sVar3) {
          lVar6 = 0;
          uVar15 = sVar3 + 1;
          do {
            pwVar5[lVar6] = (int)pcVar7[lVar6];
            uVar15 = uVar15 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar15);
          goto LAB_00134c8c;
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar10];
        lVar6 = 0;
        if ((uint)((iVar13 + 2) * -0x55555555) < 0x55555556) {
          lVar6 = -sVar3;
        }
        pwVar5 = pwVar5 + lVar6 + -1;
      }
      else {
LAB_00134c8c:
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar10];
        pwVar5 = pwVar5 + -1;
        if (((uint)((iVar13 + 2) * -0x55555555) < 0x55555556) &&
           (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
          lVar6 = 0;
          uVar10 = sVar3 + 1;
          do {
            pwVar5[lVar6] = (int)pcVar7[lVar6];
            uVar10 = uVar10 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar10);
        }
      }
      iVar13 = iVar13 + 2;
    } while (9999 < uVar14);
    if (999 < uVar14) {
      uVar10 = (ulong)(uint)((int)value * 2);
      pwVar4 = pwVar5 + -1;
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar10 + 1];
      if ((iVar13 * -0x55555555 + 0xaaaaaaabU < 0x55555556) &&
         (pwVar4 = pwVar4 + -sVar3, 0 < (long)sVar3)) {
        uVar14 = sVar3 + 1;
        lVar6 = 0;
        do {
          pwVar4[lVar6] = (int)pcVar7[lVar6];
          uVar14 = uVar14 - 1;
          lVar6 = lVar6 + 1;
        } while (1 < uVar14);
      }
LAB_00134fa3:
      wVar11 = (wchar_t)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar10];
      goto LAB_00134fb0;
    }
  }
  pwVar4 = pwVar5;
  wVar11 = (uint)value | 0x30;
LAB_00134fb0:
  pwVar4[-1] = wVar11;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}